

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> * __thiscall
kj::_::NullableValue<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
operator=(NullableValue<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
          *this,NullableValue<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>
                *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
                (&(this->field_1).value);
    }
    if (other->isSet == true) {
      OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
                (&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }